

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O3

void __thiscall KryoFlux::SamBaCommand(KryoFlux *this,string *cmd,string *end)

{
  string *psVar1;
  int iVar2;
  string s;
  uint8_t buf [512];
  long *local_278 [2];
  long local_268 [2];
  undefined1 *local_258;
  string *local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  undefined1 local_238 [520];
  
  local_258 = &local_248;
  local_250 = (string *)0x0;
  local_248 = 0;
  (**(code **)(*(long *)this + 0x28))(this,(cmd->_M_dataplus)._M_p,(int)cmd->_M_string_length);
  if (end->_M_string_length != 0) {
    do {
      do {
        iVar2 = (**(code **)(*(long *)this + 0x20))(this,local_238,0x200);
        local_278[0] = local_268;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,local_238,local_238 + iVar2);
        std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_278[0]);
        if (local_278[0] != local_268) {
          operator_delete(local_278[0],local_268[0] + 1);
        }
        psVar1 = (string *)end->_M_string_length;
      } while (local_250 < psVar1);
      iVar2 = std::__cxx11::string::compare((ulong)&local_258,(long)local_250 - (long)psVar1,psVar1)
      ;
    } while (iVar2 != 0);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
  }
  return;
}

Assistant:

void KryoFlux::SamBaCommand(const std::string& cmd, const std::string& end)
{
    std::string s;
    uint8_t buf[512];

    try
    {
        Write(cmd.c_str(), static_cast<int>(cmd.length()));

        if (!end.empty())
        {
            for (;;)
            {
                auto len = Read(buf, sizeof(buf));

                s += std::string(reinterpret_cast<char*>(buf), len);

                if (s.length() >= end.length() &&
                    s.compare(s.length() - end.length(), end.length(), end) == 0)
                {
                    break;
                }
            }
        }
    }
    catch (...)
    {
        throw util::exception("firmware upload failed, try resetting device");
    }
}